

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O1

size_t __thiscall websocketpp::http::parser::request::consume(request *this,char *buf,size_t len)

{
  size_t *psVar1;
  ulong uVar2;
  element_type *peVar3;
  size_type sVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  size_t sVar7;
  exception *peVar8;
  char *pcVar9;
  pointer pcVar10;
  ptrdiff_t _Num;
  size_t __n;
  iterator begin;
  bool bVar11;
  key_type local_b8;
  char *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if (this->m_ready == false) {
    if ((this->super_parser).m_body_bytes_needed == 0) {
      local_98 = buf;
      std::__cxx11::string::append
                ((char *)(this->m_buf).
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(ulong)buf);
      peVar3 = (this->m_buf).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      begin._M_current = (peVar3->_M_dataplus)._M_p;
      end = std::
            __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (begin._M_current,begin._M_current + peVar3->_M_string_length,"\r\n","");
      __n = (long)end._M_current - (long)begin._M_current;
      uVar2 = (this->super_parser).m_header_bytes + 3 + __n;
      (this->super_parser).m_header_bytes = uVar2;
      if (16000 < uVar2) {
LAB_001a34ce:
        peVar8 = (exception *)__cxa_allocate_exception(0x70);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Maximum header size exceeded.","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        exception::exception(peVar8,&local_b8,request_header_fields_too_large,&local_90,&local_70);
        __cxa_throw(peVar8,&exception::typeinfo,exception::~exception);
      }
      peVar3 = (this->m_buf).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      pcVar10 = (peVar3->_M_dataplus)._M_p;
      if (end._M_current != pcVar10 + peVar3->_M_string_length) {
        do {
          if (end._M_current == begin._M_current) {
            sVar4 = (this->m_method)._M_string_length;
            if (sVar4 == 0) {
              bVar11 = true;
            }
            else {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Host","");
              cVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find(&(this->super_parser).m_headers._M_t,&local_b8);
              p_Var6 = (_Base_ptr)&empty_header_abi_cxx11_;
              if ((_Rb_tree_header *)cVar5._M_node !=
                  &(this->super_parser).m_headers._M_t._M_impl.super__Rb_tree_header) {
                p_Var6 = cVar5._M_node + 2;
              }
              bVar11 = p_Var6->_M_parent == (_Base_ptr)0x0;
            }
            if ((sVar4 != 0) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2)) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            if (bVar11) {
              peVar8 = (exception *)__cxa_allocate_exception(0x70);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,"Incomplete Request","");
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              local_70._M_string_length = 0;
              local_70.field_2._M_local_buf[0] = '\0';
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              local_50._M_string_length = 0;
              local_50.field_2._M_local_buf[0] = '\0';
              exception::exception(peVar8,&local_90,bad_request,&local_70,&local_50);
              __cxa_throw(peVar8,&exception::typeinfo,exception::~exception);
            }
            peVar3 = (this->m_buf).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            this_00 = (this->m_buf).
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            pcVar10 = (peVar3->_M_dataplus)._M_p;
            sVar4 = peVar3->_M_string_length;
            (this->m_buf).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (this->m_buf).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            pcVar9 = end._M_current + (len - (long)(pcVar10 + sVar4)) + 2;
            bVar11 = parser::prepare_body(&this->super_parser);
            if (!bVar11) {
              this->m_ready = true;
              return (size_t)pcVar9;
            }
            sVar7 = parser::process_body
                              (&this->super_parser,local_98 + (long)pcVar9,len - (long)pcVar9);
            len = (size_t)(pcVar9 + sVar7);
            goto LAB_001a3265;
          }
          if ((this->m_method)._M_string_length == 0) {
            process(this,begin,(iterator)end._M_current);
          }
          else {
            parser::process_header(&this->super_parser,begin,(iterator)end._M_current);
          }
          begin._M_current = end._M_current + 2;
          peVar3 = (this->m_buf).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          end = std::
                __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (begin._M_current,(peVar3->_M_dataplus)._M_p + peVar3->_M_string_length,
                           "\r\n","");
          __n = (long)end._M_current - (long)begin._M_current;
          uVar2 = (this->super_parser).m_header_bytes + 3 + __n;
          (this->super_parser).m_header_bytes = uVar2;
          if (16000 < uVar2) goto LAB_001a34ce;
          peVar3 = (this->m_buf).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          pcVar10 = (peVar3->_M_dataplus)._M_p;
        } while (end._M_current != pcVar10 + peVar3->_M_string_length);
      }
      if (end._M_current != begin._M_current) {
        memmove(pcVar10,begin._M_current,__n);
      }
      std::__cxx11::string::resize
                ((ulong)(this->m_buf).
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(char)__n);
      psVar1 = &(this->super_parser).m_header_bytes;
      *psVar1 = *psVar1 - ((this->m_buf).
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_M_string_length;
    }
    else {
      len = parser::process_body(&this->super_parser,buf,len);
LAB_001a3265:
      if ((this->super_parser).m_body_bytes_needed == 0) {
        this->m_ready = true;
      }
    }
  }
  else {
    len = 0;
  }
  return (size_t)(char *)len;
}

Assistant:

inline size_t request::consume(char const * buf, size_t len) {
    size_t bytes_processed;
    
    if (m_ready) {return 0;}
    
    if (m_body_bytes_needed > 0) {
        bytes_processed = process_body(buf,len);
        if (body_ready()) {
            m_ready = true;
        }
        return bytes_processed;
    }

    // copy new header bytes into buffer
    m_buf->append(buf,len);

    // Search for delimiter in buf. If found read until then. If not read all
    std::string::iterator begin = m_buf->begin();
    std::string::iterator end;

    for (;;) {
        // search for line delimiter
        end = std::search(
            begin,
            m_buf->end(),
            header_delimiter,
            header_delimiter+sizeof(header_delimiter)-1
        );
        
        m_header_bytes += (end-begin+sizeof(header_delimiter));
        
        if (m_header_bytes > max_header_size) {
            // exceeded max header size
            throw exception("Maximum header size exceeded.",
                status_code::request_header_fields_too_large);
        }

        if (end == m_buf->end()) {
            // we are out of bytes. Discard the processed bytes and copy the
            // remaining unprecessed bytes to the beginning of the buffer
            std::copy(begin,end,m_buf->begin());
            m_buf->resize(static_cast<std::string::size_type>(end-begin));
            m_header_bytes -= m_buf->size();

            return len;
        }

        //the range [begin,end) now represents a line to be processed.
        if (end-begin == 0) {
            // we got a blank line
            if (m_method.empty() || get_header("Host").empty()) {
                throw exception("Incomplete Request",status_code::bad_request);
            }

            bytes_processed = (
                len - static_cast<std::string::size_type>(m_buf->end()-end)
                    + sizeof(header_delimiter) - 1
            );

            // frees memory used temporarily during request parsing
            m_buf.reset();

            // if this was not an upgrade request and has a content length
            // continue capturing content-length bytes and expose them as a 
            // request body.
            
            if (prepare_body()) {
                bytes_processed += process_body(buf+bytes_processed,len-bytes_processed);
                if (body_ready()) {
                    m_ready = true;
                }
                return bytes_processed;
            } else {
                m_ready = true;

                // return number of bytes processed (starting bytes - bytes left)
                return bytes_processed;
            }
        } else {
            if (m_method.empty()) {
                this->process(begin,end);
            } else {
                this->process_header(begin,end);
            }
        }

        begin = end+(sizeof(header_delimiter)-1);
    }
}